

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void block_move(c2m_ctx_t c2m_ctx,op_t var,op_t val,mir_size_t size)

{
  MIR_context_t ctx;
  gen_ctx_conflict *pgVar1;
  op_t index;
  op_t index_00;
  char cVar2;
  char cVar3;
  int iVar4;
  MIR_insn_t_conflict pMVar5;
  MIR_insn_t_conflict pMVar6;
  undefined1 local_118 [32];
  anon_union_32_12_57d33f68_for_u aStack_f8;
  op_t local_d8 [2];
  
  ctx = c2m_ctx->ctx;
  pgVar1 = c2m_ctx->gen_ctx;
  iVar4 = MIR_op_eq_p(ctx,var.mir_op,val.mir_op);
  if ((size != 0) && (iVar4 == 0)) {
    if (size < 6) {
      pMVar5 = MIR_new_label(ctx);
      get_new_temp(local_d8,c2m_ctx,MIR_T_I64);
      MIR_new_int_op(ctx,size);
      pMVar6 = MIR_new_insn(c2m_ctx->ctx,MIR_MOV);
      emit_insn_opt(c2m_ctx,pMVar6);
      index._8_8_ = local_d8[0]._8_8_;
      index.decl = local_d8[0].decl;
      index.mir_op.data = local_d8[0].mir_op.data;
      index.mir_op._8_8_ = local_d8[0].mir_op._8_8_;
      index.mir_op.u.i = local_d8[0].mir_op.u.i;
      index.mir_op.u.str.s = (char *)local_d8[0].mir_op.u._8_8_;
      index.mir_op.u._16_8_ = local_d8[0].mir_op.u._16_8_;
      index.mir_op.u.mem.disp = local_d8[0].mir_op.u.mem.disp;
      modify_for_block_move((op_t *)local_118,c2m_ctx,val,index);
      cVar2 = local_118[0x18];
      index_00._8_8_ = local_d8[0]._8_8_;
      index_00.decl = local_d8[0].decl;
      index_00.mir_op.data = local_d8[0].mir_op.data;
      index_00.mir_op._8_8_ = local_d8[0].mir_op._8_8_;
      index_00.mir_op.u.i = local_d8[0].mir_op.u.i;
      index_00.mir_op.u.str.s = (char *)local_d8[0].mir_op.u._8_8_;
      index_00.mir_op.u._16_8_ = local_d8[0].mir_op.u._16_8_;
      index_00.mir_op.u.mem.disp = local_d8[0].mir_op.u.mem.disp;
      modify_for_block_move((op_t *)local_118,c2m_ctx,var,index_00);
      cVar3 = local_118[0x18];
      emit_label_insn_opt(c2m_ctx,pMVar5);
      local_118._0_8_ = (pgVar1->one_op).mir_op.data;
      local_118._8_8_ = *(undefined8 *)&(pgVar1->one_op).mir_op.field_0x8;
      local_118._16_8_ = (pgVar1->one_op).mir_op.u.i;
      local_118._24_8_ = (pgVar1->one_op).mir_op.u.str.s;
      aStack_f8.i = *(int64_t *)((long)&(pgVar1->one_op).mir_op.u + 0x10);
      aStack_f8.str.s = (char *)(pgVar1->one_op).mir_op.u.mem.disp;
      pMVar6 = MIR_new_insn(c2m_ctx->ctx,MIR_SUB);
      emit_insn_opt(c2m_ctx,pMVar6);
      if ((cVar3 != '\n') || (cVar2 != '\n')) {
        __assert_fail("var.mir_op.mode == MIR_OP_MEM && val.mir_op.mode == MIR_OP_MEM",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2b31,"void block_move(c2m_ctx_t, op_t, op_t, mir_size_t)");
      }
      pMVar6 = MIR_new_insn(c2m_ctx->ctx,MIR_MOV);
      emit_insn_opt(c2m_ctx,pMVar6);
      MIR_new_label_op(ctx,pMVar5);
      local_118._0_8_ = (pgVar1->zero_op).mir_op.data;
      local_118._8_8_ = *(undefined8 *)&(pgVar1->zero_op).mir_op.field_0x8;
      local_118._16_8_ = (pgVar1->zero_op).mir_op.u.i;
      local_118._24_8_ = (pgVar1->zero_op).mir_op.u.str.s;
      aStack_f8.i = *(int64_t *)((long)&(pgVar1->zero_op).mir_op.u + 0x10);
      aStack_f8.str.s = (char *)(pgVar1->zero_op).mir_op.u.mem.disp;
      pMVar5 = MIR_new_insn(c2m_ctx->ctx,MIR_BGT);
      emit_insn_opt(c2m_ctx,pMVar5);
    }
    else {
      mem_to_address(local_d8,c2m_ctx,var,1);
      var.mir_op._8_1_ = SUB81(local_d8[0].mir_op._8_8_,0);
      var.mir_op.u.reg = (MIR_reg_t)local_d8[0].mir_op.u.i;
      if (var.mir_op._8_1_ != '\x01') {
        __assert_fail("var.mir_op.mode == MIR_OP_REG",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2b27,"void block_move(c2m_ctx_t, op_t, op_t, mir_size_t)");
      }
      gen_memcpy(c2m_ctx,0,var.mir_op.u.reg,val,size);
    }
  }
  return;
}

Assistant:

static void block_move (c2m_ctx_t c2m_ctx, op_t var, op_t val, mir_size_t size) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  MIR_context_t ctx = c2m_ctx->ctx;
  MIR_label_t repeat_label;
  op_t index;

  if (MIR_op_eq_p (ctx, var.mir_op, val.mir_op) || size == 0) return;
  if (size > 5) {
    var = mem_to_address (c2m_ctx, var, TRUE);
    assert (var.mir_op.mode == MIR_OP_REG);
    gen_memcpy (c2m_ctx, 0, var.mir_op.u.reg, val, size);
  } else {
    repeat_label = MIR_new_label (ctx);
    index = get_new_temp (c2m_ctx, MIR_T_I64);
    emit2 (c2m_ctx, MIR_MOV, index.mir_op, MIR_new_int_op (ctx, size));
    val = modify_for_block_move (c2m_ctx, val, index);
    var = modify_for_block_move (c2m_ctx, var, index);
    emit_label_insn_opt (c2m_ctx, repeat_label);
    emit3 (c2m_ctx, MIR_SUB, index.mir_op, index.mir_op, one_op.mir_op);
    assert (var.mir_op.mode == MIR_OP_MEM && val.mir_op.mode == MIR_OP_MEM);
    val.mir_op.u.mem.type = var.mir_op.u.mem.type = MIR_T_I8;
    emit2 (c2m_ctx, MIR_MOV, var.mir_op, val.mir_op);
    emit3 (c2m_ctx, MIR_BGT, MIR_new_label_op (ctx, repeat_label), index.mir_op, zero_op.mir_op);
  }
}